

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O0

int __thiscall QtMWidgets::SliderPrivate::init(SliderPrivate *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  QPalette *this_00;
  QColor *pQVar2;
  QSizePolicy local_28 [2];
  QSizePolicy sp;
  QWidget local_18 [8];
  SliderPrivate *local_10;
  SliderPrivate *this_local;
  
  local_10 = this;
  QWidget::fontMetrics(local_18);
  iVar1 = QFontMetrics::ascent();
  this->radius = iVar1;
  QFontMetrics::~QFontMetrics((QFontMetrics *)local_18);
  QSizePolicy::QSizePolicy(local_28,Expanding,Fixed,DefaultType);
  iVar1 = QAbstractSlider::orientation();
  if (iVar1 == 2) {
    QSizePolicy::transpose(local_28);
  }
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->q,0));
  this_00 = (QPalette *)QWidget::palette();
  pQVar2 = QPalette::color(this_00,Highlight);
  *(undefined8 *)&this->highlightColor = *(undefined8 *)pQVar2;
  *(undefined4 *)((long)&(this->highlightColor).ct + 4) = *(undefined4 *)((long)&pQVar2->ct + 4);
  (this->highlightColor).ct.argb.pad = (pQVar2->ct).argb.pad;
  return (int)this;
}

Assistant:

void
SliderPrivate::init()
{
	radius = q->fontMetrics().ascent();

	QSizePolicy sp( QSizePolicy::Expanding, QSizePolicy::Fixed );

	if( q->orientation() == Qt::Vertical )
		sp.transpose();

	q->setSizePolicy( sp );

	highlightColor = q->palette().color( QPalette::Highlight );
}